

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pName;
  int local_30;
  int Counter;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  Counter = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Counter) {
      Vec_PtrUniqify(p,Abc_ObjPointerCompare);
      for (Counter = 0; iVar1 = Vec_PtrSize(p), Counter < iVar1; Counter = Counter + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p,Counter);
        pAVar4 = Abc_NtkCreatePi(pNtk);
        pName = Abc_ObjName(pAVar4);
        Abc_ObjAssignName(pAVar4,pName,(char *)0x0);
        Abc_NodeSetTravIdCurrent(pAVar4);
        Abc_ObjTransferFanout(pAVar2,pAVar4);
      }
      iVar1 = Vec_PtrSize(p);
      Vec_PtrFree(p);
      return iVar1;
    }
    pAVar2 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(pAVar2), iVar1 != 0)) {
      for (local_30 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_30 < iVar1; local_30 = local_30 + 1)
      {
        pAVar4 = Abc_ObjFanin(pAVar2,local_30);
        iVar1 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar1 == 0) {
          iVar1 = Abc_NtkCheckConstant_rec(pAVar4);
          if (iVar1 == -1) {
            iVar1 = Abc_ObjIsBo(pAVar4);
            if (iVar1 != 0) {
              pAVar3 = Abc_ObjFanin0(pAVar4);
              pAVar3 = Abc_ObjFanin0(pAVar3);
              iVar1 = Abc_NtkCheckConstant_rec(pAVar3);
              if (iVar1 != -1) goto LAB_00387204;
            }
            iVar1 = Abc_ObjIsLatch(pAVar4);
            if (iVar1 != 0) {
              __assert_fail("!Abc_ObjIsLatch(pFanin)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                            ,0x377,"int Abc_NtkReplaceAutonomousLogic(Abc_Ntk_t *)");
            }
            Vec_PtrPush(p,pAVar4);
          }
          else {
LAB_00387204:
            Abc_NtkSetTravId_rec(pAVar4);
          }
        }
      }
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

int Abc_NtkReplaceAutonomousLogic( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    Vec_Ptr_t * vNodes;
    int i, k, Counter;
    // collect the nodes that feed into the reachable logic
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        // skip non-visited fanins
        if ( !Abc_NodeIsTravIdCurrent(pNode) )
            continue;
        // look for non-visited fanins
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            // skip visited fanins
            if ( Abc_NodeIsTravIdCurrent(pFanin) )
                continue;
            // skip constants and latches fed by constants
            if ( Abc_NtkCheckConstant_rec(pFanin) != -1 ||
                 (Abc_ObjIsBo(pFanin) && Abc_NtkCheckConstant_rec(Abc_ObjFanin0(Abc_ObjFanin0(pFanin))) != -1) )
            {
                Abc_NtkSetTravId_rec( pFanin );
                continue;
            }
            assert( !Abc_ObjIsLatch(pFanin) );
            Vec_PtrPush( vNodes, pFanin );
        }
    }
    Vec_PtrUniqify( vNodes, (int (*)(void))Abc_ObjPointerCompare );
    // replace these nodes by the PIs
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pFanin = Abc_NtkCreatePi(pNtk);
        Abc_ObjAssignName( pFanin, Abc_ObjName(pFanin), NULL );
        Abc_NodeSetTravIdCurrent( pFanin );
        Abc_ObjTransferFanout( pNode, pFanin );
    }
    Counter = Vec_PtrSize(vNodes);
    Vec_PtrFree( vNodes );
    return Counter;
}